

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O2

Symbols * __thiscall
inipp::Ini<wchar_t>::local_symbols
          (Symbols *__return_storage_ptr__,Ini<wchar_t> *this,String *sec_name,Section *sec)

{
  _Base_ptr p_Var1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var1 = (sec->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(sec->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    Format<wchar_t>::local_symbol
              (&local_50,
               (this->format).super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )(p_Var1 + 1));
    Format<wchar_t>::global_symbol
              (&local_70,
               (this->format).super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,sec_name,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               (p_Var1 + 1));
    std::
    vector<std::pair<std::__cxx11::wstring,std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,std::__cxx11::wstring>>>
    ::emplace_back<std::__cxx11::wstring_const,std::__cxx11::wstring_const>
              ((vector<std::pair<std::__cxx11::wstring,std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,std::__cxx11::wstring>>>
                *)__return_storage_ptr__,&local_50,&local_70);
    std::__cxx11::wstring::~wstring((wstring *)&local_70);
    std::__cxx11::wstring::~wstring((wstring *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

const Symbols local_symbols(const String & sec_name, const Section & sec) const {
		Symbols result;
		for (const auto & val : sec)
			result.emplace_back(format->local_symbol(val.first), format->global_symbol(sec_name, val.first));
		return result;
	}